

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O3

int __thiscall bhf::ads::RegistryAccess::Import(RegistryAccess *this,istream *is)

{
  pointer puVar1;
  long lVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  ostream *poVar5;
  int iVar6;
  pointer pRVar7;
  pointer pRVar8;
  char *pcVar9;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> entries;
  stringstream stream;
  string local_1f8;
  AdsDevice *local_1d8;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1d8 = &this->device;
  RegFileParse(&local_1d0,is);
  if (local_1d0.
      super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1d0.
      super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar7 = local_1d0.
             super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pRVar8 = local_1d0.
             super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if (pRVar8->keyLen == 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)pRVar8,
                   (pRVar8->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pRVar7->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pRVar7->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        puVar1 = (pRVar8->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar2 = AdsDevice::WriteReqEx
                          (local_1d8,pRVar7->hive,0,
                           (long)(pRVar8->buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,puVar1);
        if (lVar2 != 0) {
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Import",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"(): failed with: 0x",0x13);
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
          local_1f8._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1f8,1);
          std::__cxx11::stringbuf::str();
          Logger::Log(3,&local_1f8);
LAB_00120e95:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
              &local_1f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                     local_1f8._M_dataplus._M_p._0_1_));
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
          iVar6 = 1;
          goto LAB_00120ecb;
        }
      }
      else {
        pRVar7 = pRVar8;
        if (pRVar8->hive - REG_DELETE_HKEYLOCALMACHINE < 3) {
          puVar1 = (pRVar8->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar2 = AdsDevice::WriteReqEx
                            (local_1d8,pRVar8->hive,0,
                             (long)(pRVar8->buffer).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1,puVar1)
          ;
          iVar6 = (int)(ostream *)local_1a8;
          if (lVar2 == 1) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Import",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"(): failed to delete registry key \"",0x23);
            pmVar3 = std::
                     map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)g_HiveMapping_abi_cxx11_,&pRVar8->hive);
            pcVar9 = (pmVar3->_M_dataplus)._M_p + 1;
            sVar4 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
            puVar1 = (pRVar8->buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (puVar1 == (pointer)0x0) {
              std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
            }
            else {
              sVar4 = strlen((char *)puVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)puVar1,sVar4);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "\". It could not be found in the registry of the target.\n",0x38);
            std::__cxx11::stringbuf::str();
            Logger::Log(2,&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
                &local_1f8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       local_1f8._M_dataplus._M_p._0_1_));
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
          }
          else if (lVar2 != 0) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Import",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"(): failed to delete registry key \"",0x23);
            pmVar3 = std::
                     map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)g_HiveMapping_abi_cxx11_,&pRVar8->hive);
            pcVar9 = (pmVar3->_M_dataplus)._M_p + 1;
            sVar4 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar4);
            puVar1 = (pRVar8->buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (puVar1 == (pointer)0x0) {
              std::ios::clear(iVar6 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
            }
            else {
              sVar4 = strlen((char *)puVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)puVar1,sVar4);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"\" with error code: 0x",0x15);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
            local_1f8._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_1f8,1);
            std::__cxx11::stringbuf::str();
            Logger::Log(3,&local_1f8);
            goto LAB_00120e95;
          }
        }
      }
      pRVar8 = pRVar8 + 1;
    } while (pRVar8 != local_1d0.
                       super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  iVar6 = 0;
LAB_00120ecb:
  std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
            (&local_1d0);
  return iVar6;
}

Assistant:

int RegistryAccess::Import(std::istream& is) const
{
    constexpr auto SYSTEMSERVICE_REGISTRY_INVALIDKEY = 1;
    auto entries = RegFileParse(is);
    const auto* key = &entries.front();
    for (auto& next: entries) {
        if (next.keyLen) {
            key = &next;
            if (key->IsForDeletion()) {
                const auto status = device.WriteReqEx(key->hive, 0, key->buffer.size(), key->buffer.data());

                switch (status) {
                case ADSERR_NOERR:
                    break; // OK

                case SYSTEMSERVICE_REGISTRY_INVALIDKEY:
                    LOG_WARN(__FUNCTION__
                             << "(): failed to delete registry key \""
                             << (g_HiveMapping.at(key->hive).c_str() + 1)
                             << key->buffer.data()
                             << "\". It could not be found in the registry of the target.\n");
                    break; // OK: The key could not be found. But that is OK, because we wanted to delete it.

                default:
                    LOG_ERROR(__FUNCTION__
                              << "(): failed to delete registry key \""
                              << (g_HiveMapping.at(key->hive).c_str() + 1)
                              << key->buffer.data()
                              << "\" with error code: 0x"
                              << std::hex << status << '\n');
                    return 1;
                }
            }
            continue;
        }

        // Prepend key path before value name
        next.buffer.insert(next.buffer.begin(), key->buffer.cbegin(), key->buffer.cend());
        const auto status = device.WriteReqEx(key->hive, 0, next.buffer.size(), next.buffer.data());
        if (ADSERR_NOERR != status) {
            LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
            return 1;
        }
    }
    return 0;
}